

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ntlm.c
# Opt level: O0

CURLcode ntlm_decode_type2_target(Curl_easy *data,uchar *buffer,size_t size,ntlmdata *ntlm)

{
  uint uVar1;
  void *pvVar2;
  ushort local_32;
  uint target_info_offset;
  unsigned_short target_info_len;
  ntlmdata *ntlm_local;
  size_t size_local;
  uchar *buffer_local;
  Curl_easy *data_local;
  
  local_32 = 0;
  if (0x2f < size) {
    local_32 = Curl_read16_le(buffer + 0x28);
    uVar1 = Curl_read32_le(buffer + 0x2c);
    if (local_32 != 0) {
      if (((size <= uVar1) || (size < uVar1 + local_32)) || (uVar1 < 0x30)) {
        Curl_infof(data,
                   "NTLM handshake failure (bad type-2 message). Target Info Offset Len is set incorrect by the peer\n"
                  );
        return CURLE_BAD_CONTENT_ENCODING;
      }
      pvVar2 = (*Curl_cmalloc)((size_t)local_32);
      ntlm->target_info = pvVar2;
      if (ntlm->target_info == (void *)0x0) {
        return CURLE_OUT_OF_MEMORY;
      }
      memcpy(ntlm->target_info,buffer + uVar1,(ulong)local_32);
    }
  }
  ntlm->target_info_len = (uint)local_32;
  return CURLE_OK;
}

Assistant:

static CURLcode ntlm_decode_type2_target(struct Curl_easy *data,
                                         unsigned char *buffer,
                                         size_t size,
                                         struct ntlmdata *ntlm)
{
  unsigned short target_info_len = 0;
  unsigned int target_info_offset = 0;

#if defined(CURL_DISABLE_VERBOSE_STRINGS)
  (void) data;
#endif

  if(size >= 48) {
    target_info_len = Curl_read16_le(&buffer[40]);
    target_info_offset = Curl_read32_le(&buffer[44]);
    if(target_info_len > 0) {
      if((target_info_offset >= size) ||
         ((target_info_offset + target_info_len) > size) ||
         (target_info_offset < 48)) {
        infof(data, "NTLM handshake failure (bad type-2 message). "
              "Target Info Offset Len is set incorrect by the peer\n");
        return CURLE_BAD_CONTENT_ENCODING;
      }

      ntlm->target_info = malloc(target_info_len);
      if(!ntlm->target_info)
        return CURLE_OUT_OF_MEMORY;

      memcpy(ntlm->target_info, &buffer[target_info_offset], target_info_len);
    }
  }

  ntlm->target_info_len = target_info_len;

  return CURLE_OK;
}